

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O3

void Qentem::Test::TestLoopTag3(QTest *test)

{
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  QTest *this;
  long lVar4;
  Value<char> value;
  StringStream<char> ss;
  Array<Qentem::Tags::TagBit> tags_cache;
  StringStream<char> stream;
  ValueT local_a0;
  StringStream<char> local_88;
  Array<Qentem::Tags::TagBit> local_78;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_68;
  undefined8 local_58;
  char *local_50;
  SizeT local_48;
  QTest *local_38;
  
  lVar4 = 0;
  local_88.storage_ = (char *)0x0;
  local_88.length_ = 0;
  local_88.capacity_ = 0;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("\n[\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 100\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 125\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2017,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 400\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    }\n]\n    "
           [lVar1] != '\0');
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)(ZEXT416(0) << 0x40);
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            (&local_a0,(StringStream<char> *)&local_68.array_,
             "\n[\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 100\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 125\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2017,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 400\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    }\n]\n    "
             ,(SizeT)lVar4);
  uVar3 = local_68.number_;
  if (local_68.array_.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_68.number_);
  }
  operator_delete((void *)uVar3);
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("<loop value=\'val_1\' group=\'year111\' sort=\'descend\'><loop set=\'val_1\' value=\'val_2\'><loop set=\'val_2\' value=\'val_3\'>{var:val_3}</loop></loop></loop>"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_58 = 0;
  local_50 = 
  "<loop value=\'val_1\' group=\'year111\' sort=\'descend\'><loop set=\'val_1\' value=\'val_2\'><loop set=\'val_2\' value=\'val_3\'>{var:val_3}</loop></loop></loop>"
  ;
  local_48 = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\'val_1\' group=\'year111\' sort=\'descend\'><loop set=\'val_1\' value=\'val_2\'><loop set=\'val_2\' value=\'val_3\'>{var:val_3}</loop></loop></loop>"
             ,local_48,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>(test,&local_88,(char (*) [1])0x136cd5,0xc99);
  lVar4 = 0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("<loop value=\'val_1\' group=\"year\" sort=\"descend\"><loop set=\"val_1\" value=\"val_2\"><loop set=\"val_2\" value=\"val_3\">{var:val_3}</loop></loop></loop>"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_58 = 0;
  local_50 = 
  "<loop value=\'val_1\' group=\"year\" sort=\"descend\"><loop set=\"val_1\" value=\"val_2\"><loop set=\"val_2\" value=\"val_3\">{var:val_3}</loop></loop></loop>"
  ;
  local_48 = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\'val_1\' group=\"year\" sort=\"descend\"><loop set=\"val_1\" value=\"val_2\"><loop set=\"val_2\" value=\"val_3\">{var:val_3}</loop></loop></loop>"
             ,local_48,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[61]>
            (test,&local_88,
             (char (*) [61])"q11400q11450q11450q11100q11125q21200q22300q21200q22300q22300",0xca0);
  lVar4 = 0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("<loop value=\"val_1\" group=\'year\' sort=\"descend\"><loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\"><loop set=\"val_2\" value=\"val_3\"><loop set=\"val_3\" value=\"val_4\">{var:val_4}</loop></loop></loop></loop>"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_58 = 0;
  local_50 = 
  "<loop value=\"val_1\" group=\'year\' sort=\"descend\"><loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\"><loop set=\"val_2\" value=\"val_3\"><loop set=\"val_3\" value=\"val_4\">{var:val_4}</loop></loop></loop></loop>"
  ;
  local_48 = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"val_1\" group=\'year\' sort=\"descend\"><loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\"><loop set=\"val_2\" value=\"val_3\"><loop set=\"val_3\" value=\"val_4\">{var:val_4}</loop></loop></loop></loop>"
             ,local_48,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[41]>
            (test,&local_88,(char (*) [41])"1400145014501100112512002300120023002300",0xca6);
  lVar4 = 0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("<loop value=\"val_1\" group=\"year\" sort=\'descend\'>-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\" sort=\"ascend\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_58 = 0;
  local_50 = 
  "<loop value=\"val_1\" group=\"year\" sort=\'descend\'>-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\" sort=\"ascend\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
  ;
  local_48 = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"val_1\" group=\"year\" sort=\'descend\'>-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\" sort=\"ascend\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
             ,local_48,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[102]>
            (test,&local_88,
             (char (*) [102])
             "-- 2020-q1-1: 400 450 450-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2018-q2-1: 2002: 300-- 2017-q2-2: 300"
             ,0xcaf);
  lVar4 = 0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("<loop value=\"val_1\" group=\"year\">-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_58 = 0;
  local_50 = 
  "<loop value=\"val_1\" group=\"year\">-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
  ;
  local_48 = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"val_1\" group=\"year\">-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
             ,local_48,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[102]>
            (test,&local_88,
             (char (*) [102])
             "-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2017-q2-2: 300-- 2020-q1-1: 400 450 450-- 2018-q2-1: 2002: 300"
             ,0xcb8);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset(&local_a0);
  local_a0.type_ = Undefined;
  Value<char>::reset(&local_a0);
  local_68.number_ = (QNumber64)0x4;
  local_58 = CONCAT71(local_58._1_7_,6);
  local_a0.type_ = Array;
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a0.type_ != Array) {
    Value<char>::reset(&local_a0);
    local_a0.type_ = Array;
  }
  local_68.number_ = (QNumber64)0x1;
  local_58 = CONCAT71(local_58._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a0.type_ != Array) {
    Value<char>::reset(&local_a0);
    local_a0.type_ = Array;
  }
  local_68.number_ = (QNumber64)0x3;
  local_58 = CONCAT71(local_58._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a0.type_ != Array) {
    Value<char>::reset(&local_a0);
    local_a0.type_ = Array;
  }
  local_68.number_ = (QNumber64)0x5;
  local_58 = CONCAT71(local_58._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a0.type_ != Array) {
    Value<char>::reset(&local_a0);
    local_a0.type_ = Array;
  }
  local_68.number_ = (QNumber64)0x2;
  local_58 = CONCAT71(local_58._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a0.type_ != Array) {
    Value<char>::reset(&local_a0);
    local_a0.type_ = Array;
  }
  local_68.number_ = (QNumber64)0x7;
  local_58 = CONCAT71(local_58._1_7_,6);
  local_38 = test;
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a0.type_ != Array) {
    Value<char>::reset(&local_a0);
    local_a0.type_ = Array;
  }
  local_68.number_ = (QNumber64)0x6;
  local_58 = CONCAT71(local_58._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=
            ((Array<Qentem::Value<char>_> *)&local_a0,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  local_58 = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_50 = "<loop value=\"val_1\" sort=\"a\">{var:val_1}</loop>";
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_48 = 0x2f;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"val_1\" sort=\"a\">{var:val_1}</loop>",0x2f,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  this = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>
            (local_38,&local_88,(char (*) [8])"1234567",0xcc9);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_58 = 0;
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_68 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  local_50 = "<loop value=\"val_1\" sort=\"d\">{var:val_1}</loop>";
  local_48 = 0x2f;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"val_1\" sort=\"d\">{var:val_1}</loop>",0x2f,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_68.array_,&local_78,&local_a0,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(this,&local_88,(char (*) [8])"7654321",0xcce);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::~Value(&local_a0);
  pcVar2 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

static void TestLoopTag3(QTest &test) {
    StringStream<char> ss;
    const char        *content;

    Value<char> value = JSON::Parse(R"(
[
    {
        "year": 2019,
        "quarter": "q1",
        "week": 1,
        "total": 100
    },
    {
        "year": 2019,
        "quarter": "q1",
        "week": 1,
        "total": 125
    },
    {
        "year": 2019,
        "quarter": "q2",
        "week": 1,
        "total": 200
    },
    {
        "year": 2017,
        "quarter": "q2",
        "week": 2,
        "total": 300
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 400
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 450
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 450
    },
    {
        "year": 2018,
        "quarter": "q2",
        "week": 1,
        "total": 200
    },
    {
        "year": 2018,
        "quarter": "q2",
        "week": 2,
        "total": 300
    },
    {
        "year": 2019,
        "quarter": "q2",
        "week": 2,
        "total": 300
    }
]
    )");

    content =
        R"(<loop value='val_1' group='year111' sort='descend'><loop set='val_1' value='val_2'><loop set='val_2' value='val_3'>{var:val_3}</loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"()", __LINE__);
    ss.Clear();

    content =
        R"(<loop value='val_1' group="year" sort="descend"><loop set="val_1" value="val_2"><loop set="val_2" value="val_3">{var:val_3}</loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss),
                 R"(q11400q11450q11450q11100q11125q21200q22300q21200q22300q22300)", __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group='year' sort="descend"><loop set="val_1" value="val_2" group="quarter" sort="ascend"><loop set="val_2" value="val_3"><loop set="val_3" value="val_4">{var:val_4}</loop></loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(1400145014501100112512002300120023002300)", __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group="year" sort='descend'>-- {var:val_1}-<loop set="val_1" value="val_2" group="quarter" sort="ascend">{var:val_2}-<loop set="val_2" value="val_3" group="week" sort="ascend">{var:val_3}:<loop set="val_3" value="val_4"><loop set="val_4" value="val_5"> {var:val_5}</loop></loop></loop></loop></loop>)";

    test.IsEqual(
        Template::Render(content, value, ss),
        R"(-- 2020-q1-1: 400 450 450-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2018-q2-1: 2002: 300-- 2017-q2-2: 300)",
        __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group="year">-- {var:val_1}-<loop set="val_1" value="val_2" group="quarter">{var:val_2}-<loop set="val_2" value="val_3" group="week">{var:val_3}:<loop set="val_3" value="val_4"><loop set="val_4" value="val_5"> {var:val_5}</loop></loop></loop></loop></loop>)";

    test.IsEqual(
        Template::Render(content, value, ss),
        R"(-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2017-q2-2: 300-- 2020-q1-1: 400 450 450-- 2018-q2-1: 2002: 300)",
        __LINE__);
    ss.Clear();

    ////////////

    value.Reset();

    value += 4;
    value += 1;
    value += 3;
    value += 5;
    value += 2;
    value += 7;
    value += 6;

    content = R"(<loop value="val_1" sort="a">{var:val_1}</loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(1234567)", __LINE__);
    ss.Clear();

    content = R"(<loop value="val_1" sort="d">{var:val_1}</loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(7654321)", __LINE__);
    ss.Clear();
}